

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeChangeEncoding(Mem *pMem,int desiredEnc)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ushort *puVar7;
  byte *pbVar8;
  byte *pbVar9;
  ushort *puVar10;
  long lVar11;
  uint uVar12;
  byte *pbVar13;
  ushort *puVar14;
  uint uVar15;
  
  if ((pMem->flags & 2) != 0) {
    if ((uint)pMem->enc != desiredEnc) {
      if (desiredEnc == 1 || pMem->enc == 1) {
        uVar15 = pMem->n;
        if (desiredEnc == 1) {
          uVar15 = uVar15 & 0xfffffffe;
          pMem->n = uVar15;
          iVar6 = uVar15 * 2 + 1;
        }
        else {
          iVar6 = uVar15 * 2 + 2;
        }
        puVar7 = (ushort *)pMem->z;
        pbVar8 = (byte *)sqlite3DbMallocRaw(pMem->db,iVar6);
        if (pbVar8 == (byte *)0x0) {
          return 7;
        }
        puVar10 = (ushort *)((long)(int)uVar15 + (long)puVar7);
        if (pMem->enc == '\x01') {
          pbVar9 = pbVar8;
          if (desiredEnc == 2) {
            while (puVar7 < puVar10) {
              bVar2 = (byte)*puVar7;
              puVar14 = (ushort *)((long)puVar7 + 1);
              puVar7 = puVar14;
              uVar15 = (uint)bVar2;
              if (bVar2 < 0xc0) {
LAB_0012ec0f:
                *(short *)pbVar9 = (short)uVar15;
                pbVar9 = pbVar9 + 2;
              }
              else {
                uVar12 = (uint)""[bVar2 - 0xc0];
                while ((puVar7 = puVar10, puVar14 != puVar10 &&
                       (uVar5 = *puVar14, puVar7 = puVar14, ((byte)uVar5 & 0xffffffc0) == 0x80))) {
                  puVar14 = (ushort *)((long)puVar14 + 1);
                  uVar12 = uVar12 << 6 | (byte)uVar5 & 0x3f;
                }
                uVar15 = 0xfffd;
                if (((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                    ((uVar12 & 0xfffff800) == 0xd800)) || (uVar15 = uVar12, uVar12 < 0x10000))
                goto LAB_0012ec0f;
                *pbVar9 = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
                pbVar9[1] = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
                pbVar9[2] = (byte)uVar12;
                pbVar9[3] = (byte)(uVar12 >> 8) & 3 | 0xdc;
                pbVar9 = pbVar9 + 4;
              }
            }
          }
          else {
            while (puVar7 < puVar10) {
              bVar2 = (byte)*puVar7;
              puVar14 = (ushort *)((long)puVar7 + 1);
              puVar7 = puVar14;
              uVar15 = (uint)bVar2;
              if (bVar2 < 0xc0) {
LAB_0012ee37:
                uVar12 = uVar15;
                pbVar13 = pbVar9 + 1;
                *pbVar9 = (byte)(uVar12 >> 8);
                lVar11 = 2;
              }
              else {
                uVar12 = (uint)""[bVar2 - 0xc0];
                while ((puVar7 = puVar10, puVar14 != puVar10 &&
                       (uVar5 = *puVar14, puVar7 = puVar14, ((byte)uVar5 & 0xffffffc0) == 0x80))) {
                  puVar14 = (ushort *)((long)puVar14 + 1);
                  uVar12 = uVar12 << 6 | (byte)uVar5 & 0x3f;
                }
                uVar15 = 0xfffd;
                if ((((uVar12 & 0xfffffffe) == 0xfffe) || (uVar12 < 0x80)) ||
                   (((uVar12 & 0xfffff800) == 0xd800 || (uVar15 = uVar12, uVar12 < 0x10000))))
                goto LAB_0012ee37;
                *pbVar9 = (byte)(uVar12 - 0x10000 >> 0x12) & 3 | 0xd8;
                pbVar9[1] = (byte)(uVar12 - 0x10000 >> 10) & 0xc0 | (byte)(uVar12 >> 10) & 0x3f;
                pbVar13 = pbVar9 + 3;
                pbVar9[2] = (byte)(uVar12 >> 8) & 3 | 0xdc;
                lVar11 = 4;
              }
              pbVar9 = pbVar9 + lVar11;
              *pbVar13 = (byte)uVar12;
            }
          }
          pMem->n = (int)pbVar9 - (int)pbVar8;
          *pbVar9 = 0;
          pbVar9 = pbVar9 + 1;
        }
        else {
          pbVar9 = pbVar8;
          if (pMem->enc == '\x02') {
            while (puVar7 < puVar10) {
              bVar2 = (byte)*puVar7;
              puVar14 = puVar7 + 1;
              bVar1 = *(byte *)((long)puVar7 + 1);
              uVar5 = *puVar7;
              if (((bVar1 & 0xf8) == 0xd8) && (puVar14 < puVar10)) {
                uVar4 = puVar7[1];
                bVar1 = *(byte *)((long)puVar7 + 3);
                iVar6 = (uVar5 & 0x3c0) * 0x400;
                *pbVar9 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
                pbVar9[1] = (byte)(iVar6 + ((uint)bVar2 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f |
                            0x80;
                pbVar9[2] = (byte)(((bVar1 & 3) << 8 | (uint)(byte)uVar4 | (uint)bVar2 << 10) >> 6)
                            & 0x3f | 0x80;
                pbVar9[3] = (byte)uVar4 & 0x3f | 0x80;
                pbVar9 = pbVar9 + 4;
                puVar7 = puVar7 + 2;
              }
              else {
                puVar7 = puVar14;
                if (uVar5 < 0x80) {
                  *pbVar9 = bVar2;
                  pbVar9 = pbVar9 + 1;
                }
                else if (bVar1 < 8) {
                  *pbVar9 = (byte)(uVar5 >> 6) | 0xc0;
                  pbVar9[1] = bVar2 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 2;
                }
                else {
                  *pbVar9 = bVar1 >> 4 | 0xe0;
                  pbVar9[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                  pbVar9[2] = bVar2 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 3;
                }
              }
            }
          }
          else {
            while (puVar7 < puVar10) {
              bVar2 = (byte)*puVar7;
              puVar14 = puVar7 + 1;
              bVar1 = *(byte *)((long)puVar7 + 1);
              uVar5 = CONCAT11(bVar2,bVar1);
              if (((bVar2 & 0xf8) == 0xd8) && (puVar14 < puVar10)) {
                uVar4 = puVar7[1];
                bVar2 = *(byte *)((long)puVar7 + 3);
                iVar6 = (uVar5 & 0x3c0) * 0x400;
                *pbVar9 = (byte)(iVar6 + 0x10000U >> 0x12) | 0xf0;
                pbVar9[1] = (byte)(iVar6 + ((uint)bVar1 << 10 & 0xf000) + 0x10000 >> 0xc) & 0x3f |
                            0x80;
                pbVar9[2] = (byte)((((byte)uVar4 & 3) << 8 | (uint)bVar2 | (uint)bVar1 << 10) >> 6)
                            & 0x3f | 0x80;
                pbVar9[3] = bVar2 & 0x3f | 0x80;
                pbVar9 = pbVar9 + 4;
                puVar7 = puVar7 + 2;
              }
              else {
                puVar7 = puVar14;
                if (uVar5 < 0x80) {
                  *pbVar9 = bVar1;
                  pbVar9 = pbVar9 + 1;
                }
                else if (bVar2 < 8) {
                  *pbVar9 = (byte)(uVar5 >> 6) | 0xc0;
                  pbVar9[1] = bVar1 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 2;
                }
                else {
                  *pbVar9 = bVar2 >> 4 | 0xe0;
                  pbVar9[1] = (byte)(uVar5 >> 6) & 0x3f | 0x80;
                  pbVar9[2] = bVar1 & 0x3f | 0x80;
                  pbVar9 = pbVar9 + 3;
                }
              }
            }
          }
          pMem->n = (int)pbVar9 - (int)pbVar8;
        }
        *pbVar9 = 0;
        sqlite3VdbeMemRelease(pMem);
        uVar3 = pMem->flags;
        pMem->enc = (u8)desiredEnc;
        pMem->flags = uVar3 & 0xe1ff | 0x600;
        pMem->z = (char *)pbVar8;
        pMem->zMalloc = (char *)pbVar8;
      }
      else {
        iVar6 = sqlite3VdbeMemMakeWriteable(pMem);
        if (iVar6 != 0) {
          return 7;
        }
        puVar7 = (ushort *)pMem->z;
        puVar10 = (ushort *)(((long)pMem->n & 0xfffffffffffffffeU) + (long)puVar7);
        for (; puVar7 < puVar10; puVar7 = puVar7 + 1) {
          *puVar7 = *puVar7 << 8 | *puVar7 >> 8;
        }
        pMem->enc = (u8)desiredEnc;
      }
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeChangeEncoding(Mem *pMem, int desiredEnc){
#ifndef SQLITE_OMIT_UTF16
  int rc;
#endif
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( desiredEnc==SQLITE_UTF8 || desiredEnc==SQLITE_UTF16LE
           || desiredEnc==SQLITE_UTF16BE );
  if( !(pMem->flags&MEM_Str) || pMem->enc==desiredEnc ){
    return SQLITE_OK;
  }
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
#ifdef SQLITE_OMIT_UTF16
  return SQLITE_ERROR;
#else

  /* MemTranslate() may return SQLITE_OK or SQLITE_NOMEM. If NOMEM is returned,
  ** then the encoding of the value may not have changed.
  */
  rc = sqlite3VdbeMemTranslate(pMem, (u8)desiredEnc);
  assert(rc==SQLITE_OK    || rc==SQLITE_NOMEM);
  assert(rc==SQLITE_OK    || pMem->enc!=desiredEnc);
  assert(rc==SQLITE_NOMEM || pMem->enc==desiredEnc);
  return rc;
#endif
}